

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluNativeWindow.cpp
# Opt level: O0

void __thiscall eglu::NativeWindow::readScreenPixels(NativeWindow *this,TextureLevel *param_1)

{
  deBool dVar1;
  InternalError *this_00;
  NotSupportedError *this_01;
  TextureLevel *param_1_local;
  NativeWindow *this_local;
  
  while( true ) {
    dVar1 = ::deGetFalse();
    if ((dVar1 != 0) || ((this->m_capabilities & CAPABILITY_READ_SCREEN_PIXELS) != 0)) break;
    dVar1 = ::deGetFalse();
    if (dVar1 == 0) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,"eglu::NativeWindow doesn\'t support readScreenPixels",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluNativeWindow.cpp"
                 ,0x48);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  this_00 = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (this_00,(char *)0x0,"(m_capabilities & CAPABILITY_READ_SCREEN_PIXELS) == 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluNativeWindow.cpp"
             ,0x47);
  __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
}

Assistant:

void NativeWindow::readScreenPixels (tcu::TextureLevel*) const
{
	TCU_CHECK_INTERNAL((m_capabilities & CAPABILITY_READ_SCREEN_PIXELS) == 0);
	throw tcu::NotSupportedError("eglu::NativeWindow doesn't support readScreenPixels", DE_NULL, __FILE__, __LINE__);
}